

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::TokenManager::ParsePublicKey
          (Error *__return_storage_ptr__,TokenManager *this,mbedtls_pk_context *aPublicKey,
          ByteArray *aCert)

{
  uchar *buf;
  uchar *puVar1;
  int aMbedtlsError;
  char *begin;
  char *pcVar2;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  undefined1 local_388 [8];
  string local_380;
  parse_func local_360 [1];
  string local_358;
  undefined1 local_338 [40];
  mbedtls_x509_crt_conflict cert;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  mbedtls_x509_crt_init((mbedtls_x509_crt *)&cert);
  buf = (aCert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (aCert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (buf == puVar1) {
    local_388._0_4_ = none_type;
    local_380._M_dataplus._M_p = "the raw certificate is empty";
    local_380._M_string_length = 0x1c;
    local_380.field_2._M_allocated_capacity = 0;
    local_360[0] = (parse_func)0x0;
    pcVar2 = "the raw certificate is empty";
    local_380.field_2._8_8_ = local_388;
    while (begin = pcVar2, begin != "") {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_388);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_388;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_358,(v10 *)"the raw certificate is empty",(string_view)ZEXT816(0x1c),args);
    local_338._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_338 + 8),(string *)&local_358);
    Error::operator=(__return_storage_ptr__,(Error *)local_338);
    std::__cxx11::string::~string((string *)(local_338 + 8));
    this_00 = &local_358;
  }
  else {
    aMbedtlsError = mbedtls_x509_crt_parse((mbedtls_x509_crt *)&cert,buf,(long)puVar1 - (long)buf);
    if (aMbedtlsError == 0) {
      MoveMbedtlsKey(aPublicKey,&cert.pk);
      goto LAB_00177904;
    }
    ErrorFromMbedtlsError((Error *)local_388,aMbedtlsError);
    Error::operator=(__return_storage_ptr__,(Error *)local_388);
    std::__cxx11::string::~string((string *)(local_388 + 8));
    local_388._0_4_ = uint_type;
    this_00 = (string *)(local_388 + 8);
    std::__cxx11::string::string((string *)this_00,(string *)&__return_storage_ptr__->mMessage);
    Error::operator=(__return_storage_ptr__,(Error *)local_388);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00177904:
  mbedtls_x509_crt_free((mbedtls_x509_crt *)&cert);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ParsePublicKey(mbedtls_pk_context &aPublicKey, const ByteArray &aCert)
{
    Error            error;
    mbedtls_x509_crt cert;

    mbedtls_x509_crt_init(&cert);

    VerifyOrExit(!aCert.empty(), error = ERROR_INVALID_ARGS("the raw certificate is empty"));
    if (int fail = mbedtls_x509_crt_parse(&cert, aCert.data(), aCert.size()))
    {
        error = ErrorFromMbedtlsError(fail);
        ExitNow(error = {ErrorCode::kInvalidArgs, error.GetMessage()});
    }

    // Steal the public key from the 'cert' object.
    MoveMbedtlsKey(aPublicKey, cert.pk);

exit:
    mbedtls_x509_crt_free(&cert);

    return error;
}